

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lprowsetbase.h
# Opt level: O3

void __thiscall soplex::LPRowSetBase<double>::clear(LPRowSetBase<double> *this)

{
  SVSetBase<double>::clear(&this->super_SVSetBase<double>,-1);
  VectorBase<double>::reDim(&this->left,(this->super_SVSetBase<double>).set.thenum,true);
  VectorBase<double>::reDim(&this->right,(this->super_SVSetBase<double>).set.thenum,true);
  VectorBase<double>::reDim(&this->object,(this->super_SVSetBase<double>).set.thenum,true);
  (this->scaleExp).thesize = 0;
  return;
}

Assistant:

void clear()
   {
      SVSetBase<R>::clear();
      left.reDim(num());
      right.reDim(num());
      object.reDim(num());
      scaleExp.clear();
   }